

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestDateTime::~TestDateTime(TestDateTime *this)

{
  TestDateTime *this_local;
  
  *(undefined ***)this = &PTR_metaObject_0023f4d8;
  QFont::~QFont(&this->m_font);
  QList<int>::~QList(&this->m_tSections);
  QList<int>::~QList(&this->m_dSections);
  QList<int>::~QList(&this->m_dtSections);
  QSharedPointer<QtMWidgets::TimePicker>::~QSharedPointer(&this->m_t);
  QSharedPointer<QtMWidgets::DatePicker>::~QSharedPointer(&this->m_d);
  QSharedPointer<QtMWidgets::DateTimePicker>::~QSharedPointer(&this->m_dt);
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

Q_OBJECT

private slots:

	void initTestCase()
	{
		m_dt.reset( new QtMWidgets::DateTimePicker );
		m_dt->setFormat( QStringLiteral( "ddd MMMM yyyy hh mm a" ) );

		m_dt->setMouseTracking( true );

		m_font = m_dt->font();
		m_font.setBold( true );
		m_dt->setFont( m_font );

		QFontMetrics fm( m_font );
		m_height = fm.boundingRect( QLatin1String( "AM" ) ).height();
		m_height += m_height / 3;

		m_delta = QPoint( 0, -m_height );

		m_d.reset( new QtMWidgets::DatePicker );
		m_d->setFormat( QStringLiteral( "dddd MMM yyyy" ) );
		m_d->setFont( m_font );

		m_t.reset( new QtMWidgets::TimePicker );
		m_t->setFormat( QStringLiteral( "hh mm" ) );
		m_t->setFont( m_font );

		{
			QStyleOption opt;
			opt.initFrom( m_dt.data() );

			QtMWidgets::Section s1( QtMWidgets::Section::DaySectionShort );

			int sw = s1.maxWidth( opt ) + 5 * 2 + 6;
			int w = sw;

			m_dtSections.append( sw / 2 );

			QtMWidgets::Section s2( QtMWidgets::Section::MonthSectionLong );

			sw = s2.maxWidth( opt ) + 5 * 2 + 6;

			m_dtSections.append( w + sw / 2 );

			w += sw;

			QtMWidgets::Section s3( QtMWidgets::Section::YearSection );

			sw = s3.maxWidth( opt ) + 5 * 2 + 6;

			m_dtSections.append( w + sw / 2 );

			w += sw;

			QtMWidgets::Section s4( QtMWidgets::Section::Hour12Section );

			sw = s4.maxWidth( opt ) + 5 * 2 + 6;

			m_dtSections.append( w + sw / 2 );

			w += sw;

			QtMWidgets::Section s5( QtMWidgets::Section::MinuteSection );

			sw = s5.maxWidth( opt ) + 5 * 2 + 6;

			m_dtSections.append( w + sw / 2 );

			w += sw;

			QtMWidgets::Section s6( QtMWidgets::Section::AmPmSection );

			sw = s6.maxWidth( opt ) + 5 * 2 + 6;

			m_dtSections.append( w + sw / 2 );
		}

		{
			QStyleOption opt;
			opt.initFrom( m_d.data() );

			QtMWidgets::Section s1( QtMWidgets::Section::DaySectionLong );

			int sw = s1.maxWidth( opt ) + 5 * 2 + 6;
			int w = sw;

			m_dSections.append( sw / 2 );

			QtMWidgets::Section s2( QtMWidgets::Section::MonthSectionShort );

			sw = s2.maxWidth( opt ) + 5 * 2 + 6;

			m_dSections.append( w + sw / 2 );

			w += sw;

			QtMWidgets::Section s3( QtMWidgets::Section::YearSection );

			sw = s3.maxWidth( opt ) + 5 * 2 + 6;

			m_dSections.append( w + sw / 2 );
		}

		{
			QStyleOption opt;
			opt.initFrom( m_t.data() );

			QtMWidgets::Section s4( QtMWidgets::Section::Hour24Section );

			int sw = s4.maxWidth( opt ) + 5 * 2 + 6;
			int w = sw;

			m_tSections.append( sw / 2 );

			QtMWidgets::Section s5( QtMWidgets::Section::MinuteSection );

			sw = s5.maxWidth( opt ) + 5 * 2 + 6;

			m_tSections.append( w + sw / 2 );
		}
	}